

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_rms_norm_impl(ggml_context *ctx,ggml_tensor *a,_Bool inplace)

{
  byte in_DL;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  ggml_tensor *local_28;
  
  if (((in_DL & 1) == 0) && (in_RSI->grad != (ggml_tensor *)0x0)) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xe2e,
            "false");
    abort();
  }
  if ((in_DL & 1) == 0) {
    local_28 = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    local_28 = ggml_view_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  local_28->op = GGML_OP_RMS_NORM;
  local_28->grad = (ggml_tensor *)0x0;
  local_28->src0 = in_RSI;
  local_28->src1 = (ggml_tensor *)0x0;
  return local_28;
}

Assistant:

struct ggml_tensor * ggml_rms_norm_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        bool inplace) {
    bool is_node = false;

    if (!inplace && (a->grad)) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_RMS_NORM;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store epsilon here?

    return result;
}